

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

int fmt::v9::detail::compare(bigint *lhs,bigint *rhs)

{
  bool bVar1;
  int iVar2;
  bigit bVar3;
  bigit bVar4;
  uint uVar5;
  int iVar6;
  int index;
  int index_00;
  
  index = (int)(lhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar2 = lhs->exp_ + index;
  index_00 = (int)(rhs->bigits_).super_buffer<unsigned_int>.size_;
  iVar6 = rhs->exp_ + index_00;
  if (iVar2 == iVar6) {
    iVar2 = 0;
    if (0 < index - index_00) {
      iVar2 = index - index_00;
    }
    do {
      if (index <= iVar2) {
        if (index_00 == index) {
          return 0;
        }
        bVar1 = index_00 < index;
        goto LAB_001ce1f7;
      }
      index = index + -1;
      index_00 = index_00 + -1;
      bVar3 = bigint::operator[](lhs,index);
      bVar4 = bigint::operator[](rhs,index_00);
    } while (bVar3 == bVar4);
    uVar5 = (bVar4 < bVar3) - 1 | 1;
  }
  else {
    bVar1 = iVar6 < iVar2;
LAB_001ce1f7:
    uVar5 = (uint)bVar1 * 2 - 1;
  }
  return uVar5;
}

Assistant:

void append(const ContiguousRange& range) {
    append(range.data(), range.data() + range.size());
  }